

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void avg_nmv(nmv_context *nmv_left,nmv_context *nmv_tr,int wt_left,int wt_tr)

{
  long lVar1;
  
  avg_cdf_symbol(nmv_left->joints_cdf,nmv_tr->joints_cdf,1,5,4,wt_left,wt_tr);
  for (lVar1 = 0; lVar1 != 0x114; lVar1 = lVar1 + 0x8a) {
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].classes_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].classes_cdf + lVar1),1,0xc,0xb,wt_left,
                   wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].class0_fp_cdf[0] + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].class0_fp_cdf[0] + lVar1),2,5,4,wt_left,
                   wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].fp_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].fp_cdf + lVar1),1,5,4,wt_left,wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].sign_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].sign_cdf + lVar1),1,3,2,wt_left,wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].class0_hp_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].class0_hp_cdf + lVar1),1,3,2,wt_left,
                   wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].hp_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].hp_cdf + lVar1),1,3,2,wt_left,wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].class0_cdf + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].class0_cdf + lVar1),1,3,2,wt_left,wt_tr);
    avg_cdf_symbol((aom_cdf_prob *)((long)nmv_left->comps[0].bits_cdf[0] + lVar1),
                   (aom_cdf_prob *)((long)nmv_tr->comps[0].bits_cdf[0] + lVar1),10,3,2,wt_left,wt_tr
                  );
  }
  return;
}

Assistant:

static void avg_nmv(nmv_context *nmv_left, nmv_context *nmv_tr, int wt_left,
                    int wt_tr) {
  AVERAGE_CDF(nmv_left->joints_cdf, nmv_tr->joints_cdf, 4);
  for (int i = 0; i < 2; i++) {
    AVERAGE_CDF(nmv_left->comps[i].classes_cdf, nmv_tr->comps[i].classes_cdf,
                MV_CLASSES);
    AVERAGE_CDF(nmv_left->comps[i].class0_fp_cdf,
                nmv_tr->comps[i].class0_fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].fp_cdf, nmv_tr->comps[i].fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].sign_cdf, nmv_tr->comps[i].sign_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_hp_cdf,
                nmv_tr->comps[i].class0_hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].hp_cdf, nmv_tr->comps[i].hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_cdf, nmv_tr->comps[i].class0_cdf,
                CLASS0_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].bits_cdf, nmv_tr->comps[i].bits_cdf, 2);
  }
}